

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::matchGlobalVars(ClauseMatcher *this,int *resolvedQueryLit)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint val;
  size_t sVar4;
  ILStruct *pIVar5;
  int *piVar6;
  uint *puVar7;
  MatchInfo **ppMVar8;
  MatchInfo **__b;
  LitInfo *pLVar9;
  uint *in_RSI;
  TriangularArray<int> *in_RDI;
  MatchInfo *mi;
  ILStruct *ils_1;
  uint i_1;
  MatchInfo *nq;
  uint k;
  uint rem;
  ILStruct *ni;
  uint j_1;
  MatchInfo *bq;
  ILStruct *bi;
  uint i;
  uint failLev;
  ILStruct *ils;
  uint j;
  uint clen;
  uint in_stack_ffffffffffffff4c;
  ILStruct *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  TriangularArray<int> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  DArray<int> *in_stack_ffffffffffffff78;
  MatchInfo *pMVar10;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar11;
  undefined4 in_stack_ffffffffffffffa8;
  uint uVar12;
  uint local_40;
  uint local_3c;
  uint local_30;
  
  sVar4 = Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                  *)(in_RDI + 2));
  uVar2 = (int)sVar4 - 1;
  if ((matchGlobalVars(int&)::remaining == '\0') &&
     (iVar3 = __cxa_guard_acquire(&matchGlobalVars(int&)::remaining), iVar3 != 0)) {
    Lib::TriangularArray<int>::TriangularArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_atexit(Lib::TriangularArray<int>::~TriangularArray,&matchGlobalVars::remaining,
                 &__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::remaining);
  }
  Lib::TriangularArray<int>::setSide
            (in_RDI,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
    Lib::
    Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
    ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                  *)(in_RDI + 2),(ulong)local_30);
    Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)0x2f74fe);
    pIVar5 = LiteralMatcher::getILS((LiteralMatcher *)0x2f7506);
    Lib::TriangularArray<int>::set(&matchGlobalVars::remaining,(ulong)local_30,0,pIVar5->matchCnt);
  }
  if ((matchGlobalVars(int&)::matchIndex == '\0') &&
     (iVar3 = __cxa_guard_acquire(&matchGlobalVars(int&)::matchIndex), iVar3 != 0)) {
    Lib::DArray<int>::DArray((DArray<int> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_atexit(Lib::DArray<int>::~DArray,&matchGlobalVars::matchIndex,&__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::matchIndex);
  }
  Lib::DArray<int>::ensure(in_stack_ffffffffffffff78,(size_t)in_RDI);
  local_3c = 0;
  local_40 = 0;
LAB_002f75e1:
  if (uVar2 <= local_40) {
    *in_RSI = 0xffffffff;
    if (((ulong)in_RDI->_data & 1) != 0) {
      for (uVar12 = 0; uVar12 < uVar2; uVar12 = uVar12 + 1) {
        Lib::
        Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
        ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                      *)(in_RDI + 2),(ulong)uVar12);
        Lib::
        Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    *)0x2f78c2);
        pIVar5 = LiteralMatcher::getILS((LiteralMatcher *)0x2f78ca);
        Lib::DArray<int>::operator[](&matchGlobalVars::matchIndex,(ulong)uVar12);
        ppMVar8 = CodeTree::ILStruct::getMatch(pIVar5,in_stack_ffffffffffffff4c);
        pMVar10 = *ppMVar8;
        pLVar9 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                           ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 1),
                            (ulong)*(uint *)pMVar10);
        if ((pLVar9->opposite & 1U) != 0) {
          pLVar9 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                             ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 1),
                              (ulong)*(uint *)pMVar10);
          *in_RSI = pLVar9->litIndex;
          return true;
        }
      }
    }
    return true;
  }
  piVar6 = Lib::DArray<int>::operator[](&matchGlobalVars::matchIndex,(ulong)local_40);
  *piVar6 = -1;
  if (local_40 != 0) {
    local_3c = 0x14;
  }
  do {
    while( true ) {
      piVar6 = Lib::DArray<int>::operator[](&matchGlobalVars::matchIndex,(ulong)local_40);
      *piVar6 = *piVar6 + 1;
      piVar6 = Lib::DArray<int>::operator[](&matchGlobalVars::matchIndex,(ulong)local_40);
      iVar3 = *piVar6;
      piVar6 = Lib::TriangularArray<int>::get
                         (&matchGlobalVars::remaining,(ulong)local_40,(ulong)local_40);
      if (iVar3 != *piVar6) break;
      if (local_40 == 0) {
        return false;
      }
      local_40 = local_40 - 1;
    }
    Lib::
    Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
    ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                  *)(in_RDI + 2),(ulong)local_40);
    Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)0x2f76d3);
    LiteralMatcher::getILS((LiteralMatcher *)0x2f76db);
    Lib::DArray<int>::operator[](&matchGlobalVars::matchIndex,(ulong)local_40);
    CodeTree::ILStruct::getMatch(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    uVar12 = local_40;
    while( true ) {
      uVar12 = uVar12 + 1;
      if (uVar2 <= uVar12) {
        local_40 = local_40 + 1;
        goto LAB_002f75e1;
      }
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::operator[]((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    *)(in_RDI + 2),(ulong)uVar12);
      Lib::
      Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
      operator->((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)0x2f7748);
      pIVar5 = LiteralMatcher::getILS((LiteralMatcher *)0x2f7750);
      puVar7 = (uint *)Lib::TriangularArray<int>::get
                                 (&matchGlobalVars::remaining,(ulong)uVar12,(ulong)local_40);
      val = *puVar7;
      uVar11 = 0;
      while (uVar11 < val) {
        ppMVar8 = CodeTree::ILStruct::getMatch(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        bVar1 = compatible((ClauseMatcher *)CONCAT44(uVar12,in_stack_ffffffffffffffa8),pIVar5,
                           (MatchInfo *)CONCAT44(val,uVar11),(ILStruct *)*ppMVar8,
                           (MatchInfo *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (bVar1) {
          uVar11 = uVar11 + 1;
        }
        else {
          val = val - 1;
          ppMVar8 = CodeTree::ILStruct::getMatch
                              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          __b = CodeTree::ILStruct::getMatch(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          std::swap<Indexing::CodeTree::MatchInfo*>(ppMVar8,__b);
        }
      }
      if (val == 0) break;
      Lib::TriangularArray<int>::set
                (&matchGlobalVars::remaining,(ulong)uVar12,(ulong)(local_40 + 1),val);
    }
    if (local_3c < uVar12) {
      local_3c = uVar12;
    }
  } while( true );
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::matchGlobalVars(int& resolvedQueryLit)
{
  //TODO: perform _set_, not _multiset_ subsumption for subsumption resolution

//  bool verbose=query->number()==58746;
//#define VERB_OUT(x) if(verbose) {cout<<x<<endl;}

  unsigned clen=lms.size()-1;

  //remaining[j,0] contains number of matches for j-th index literal
  //remaining[j,i+1] (for j>i) contains number of matches for j-th
  //  index literal compatible with the bindings of i-th literal (and
  //  those before it)
  //remaining[j,j] therefore contains number of matches we have to try
  //  when we get to binding j-th literal
  //  Matches in ILStruct::matches are reordered, so that we always try
  //  the _first_ remaining[j,j] literals
  static TriangularArray<int> remaining(10);
  remaining.setSide(clen);
  for(unsigned j=0;j<clen;j++) {
    ILStruct* ils=lms[j]->getILS();
    remaining.set(j,0,ils->matchCnt);

//    VERB_OUT("matches "<<ils->matches.size()<<" index:"<<j<<" vars:"<<ils->varCnt<<" linfos:"<<lInfos.size());
//    for(unsigned y=0;y<ils->matches.size();y++) {
//      LitInfo* linf=&lInfos[ils->matches[y]->liIndex];
//      VERB_OUT(" match "<<y<<" liIndex:"<<ils->matches[y]->liIndex<<" op: "<<linf->opposite);
//      VERB_OUT(" hdr: "<<(*linf->ft)[0].number());
//    }
//    for(unsigned x=0;x<ils->varCnt;x++) {
//      VERB_OUT(" glob var: "<<ils->sortedGlobalVarNumbers[x]);
//      for(unsigned y=0;y<ils->matches.size();y++) {
//	VERB_OUT(" match "<<y<<" binding: "<<ils->matches[y]->bindings[x]);
//      }
//    }
  }
//  VERB_OUT("secOp:"<<(lms[1]->op-1)->instr()<<" "<<(lms[1]->op-1)->arg());

  static DArray<int> matchIndex;
  matchIndex.ensure(clen);
  unsigned failLev=0;
  for(unsigned i=0;i<clen;i++) {
    matchIndex[i]=-1;
    if(i>0) { failLev=20; }
  bind_next_match:
    matchIndex[i]++;
    if(matchIndex[i]==remaining.get(i,i)) {
      //no more choices at this level, so try going up
      if(i==0) {
	RSTAT_MCTR_INC("zero level fails at", failLev);
	return false;
      }
      i--;
      goto bind_next_match;
    }
    ASS_L(matchIndex[i],remaining.get(i,i));

    ILStruct* bi=lms[i]->getILS(); 		//bound index literal
    MatchInfo* bq=bi->getMatch(matchIndex[i]);	//bound query literal

    //propagate the implications of this binding to next literals
    for(unsigned j=i+1;j<clen;j++) {
      ILStruct* ni=lms[j]->getILS();		//next index literal
      unsigned rem=remaining.get(j,i);
      unsigned k=0;
      while(k<rem) {
	MatchInfo* nq=ni->getMatch(k);		//next query literal
	if(!compatible(bi,bq,ni,nq)) {
	  rem--;
	  swap(ni->getMatch(k),ni->getMatch(rem));
	  continue;
	}
	k++;
      }
      if(rem==0) {
	if(failLev<j) { failLev=j; }
	goto bind_next_match;
      }
      remaining.set(j,i+1,rem);
    }
  }

  resolvedQueryLit=-1;
  if(sres) {
    for(unsigned i=0;i<clen;i++) {
      ILStruct* ils=lms[i]->getILS();
      MatchInfo* mi=ils->getMatch(matchIndex[i]);
      if(lInfos[mi->liIndex].opposite) {
	resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	break;
      }
    }
  }

  return true;
}